

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderConstExprTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::ShaderConstExprBuiltinTests::addChildGroup
          (ShaderConstExprBuiltinTests *this,char *name,char *desc,TestParams *cases,int numCases)

{
  TestContext *testContext;
  RenderContext *renderContext;
  ContextInfo *contextInfo;
  TestNode *node;
  size_type sVar1;
  const_reference ppTVar2;
  int local_60;
  int i;
  TestCaseGroup *group;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> children;
  int numCases_local;
  TestParams *cases_local;
  char *desc_local;
  char *name_local;
  ShaderConstExprBuiltinTests *this_local;
  
  testContext = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = numCases;
  renderContext = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  contextInfo = gles2::Context::getContextInfo((this->super_TestCaseGroup).m_context);
  deqp::gls::ShaderConstExpr::createTests
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&group,testContext,
             renderContext,contextInfo,cases,
             children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_,GLSL_VERSION_100_ES,SHADER_BOTH);
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,name,desc);
  tcu::TestNode::addChild((TestNode *)this,node);
  local_60 = 0;
  while( true ) {
    sVar1 = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::size
                      ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&group);
    if ((int)sVar1 <= local_60) break;
    ppTVar2 = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::operator[]
                        ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&group,
                         (long)local_60);
    tcu::TestNode::addChild(node,*ppTVar2);
    local_60 = local_60 + 1;
  }
  std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~vector
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&group);
  return;
}

Assistant:

void ShaderConstExprBuiltinTests::addChildGroup (const char* name, const char* desc, const gls::ShaderConstExpr::TestParams* cases, int numCases)
{
	const std::vector<tcu::TestNode*>	children = createTests(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), cases, numCases, glu::GLSL_VERSION_100_ES);
	tcu::TestCaseGroup*					group	 = new tcu::TestCaseGroup(m_testCtx, name, desc);

	addChild(group);

	for (int i = 0; i < (int)children.size(); i++)
		group->addChild(children[i]);
}